

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicBasicObjects(JSContext *ctx)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue proto_00;
  JSValue obj;
  JSValue proto_val;
  JSShape *pJVar3;
  JSContext *in_RDI;
  JSValue JVar4;
  int i;
  JSValue proto;
  undefined4 in_stack_fffffffffffffef8;
  int32_t iVar5;
  undefined4 in_stack_fffffffffffffefc;
  JSAtom atom;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff04;
  int len;
  undefined4 in_stack_ffffffffffffff08;
  JSClassID in_stack_ffffffffffffff0c;
  JSContext *in_stack_ffffffffffffff10;
  JSContext *ctx_00;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  JSValue *name;
  JSContext *p;
  JSContext *in_stack_ffffffffffffff40;
  JSObject *proto_01;
  JSContext *ctx_01;
  JSValue in_stack_ffffffffffffff50;
  JSValue in_stack_ffffffffffffff60;
  JSValueUnion local_78;
  JSValueUnion local_70;
  JSShape *local_68;
  JSValueUnion local_60;
  anon_struct_8_11_b11cd4a7_for_anon_union_24_2_15ee5962_for_JSObject_0_1 local_58;
  JSValueUnion local_50;
  int64_t local_48;
  JSValueUnion local_30;
  int64_t local_28;
  int local_1c;
  
  name = in_RDI->class_proto;
  JVar4.u._4_4_ = in_stack_fffffffffffffefc;
  JVar4.u.int32 = in_stack_fffffffffffffef8;
  JVar4.tag._0_4_ = in_stack_ffffffffffffff00;
  JVar4.tag._4_4_ = in_stack_ffffffffffffff04;
  JVar4 = JS_NewObjectProto((JSContext *)0x11e2b4,JVar4);
  local_30 = JVar4.u;
  name[1].u = local_30;
  local_28 = JVar4.tag;
  name[1].tag = local_28;
  JVar1 = in_RDI->class_proto[1].u;
  iVar5 = JVar1.int32;
  atom = JVar1._4_4_;
  iVar2 = in_RDI->class_proto[1].tag;
  uVar6 = (undefined4)iVar2;
  len = (int)((ulong)iVar2 >> 0x20);
  p = in_RDI;
  JVar4 = JS_NewCFunction3(in_stack_ffffffffffffff40,(JSCFunction *)in_RDI,(char *)name,
                           (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                           (JSCFunctionEnum)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                           in_stack_ffffffffffffff60);
  local_50 = JVar4.u;
  (p->function_proto).u = local_50;
  local_48 = JVar4.tag;
  (p->function_proto).tag = local_48;
  proto_01 = (JSObject *)in_RDI->class_proto;
  JVar4 = JS_DupValue(in_RDI,in_RDI->function_proto);
  local_60 = JVar4.u;
  proto_01[2].u.func.home_object = (JSObject *)local_60;
  local_58 = (anon_struct_8_11_b11cd4a7_for_anon_union_24_2_15ee5962_for_JSObject_0_1)JVar4.tag;
  proto_01[3].field_0.field_1 = local_58;
  ctx_01 = (JSContext *)in_RDI->class_proto;
  JVar4 = JS_NewObject((JSContext *)0x11e3e7);
  local_70 = JVar4.u;
  *(JSValueUnion *)&ctx_01->binary_object_count = local_70;
  local_68 = (JSShape *)JVar4.tag;
  ctx_01->array_shape = local_68;
  obj.tag._0_4_ = in_stack_ffffffffffffff20;
  obj.u.ptr = (void *)in_stack_ffffffffffffff18;
  obj.tag._4_4_ = in_stack_ffffffffffffff24;
  JS_SetPropertyFunctionList
            (in_stack_ffffffffffffff10,obj,
             (JSCFunctionListEntry *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             len);
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    proto_00.u._4_4_ = atom;
    proto_00.u.int32 = iVar5;
    proto_00.tag._0_4_ = uVar6;
    proto_00.tag._4_4_ = len;
    JVar4 = JS_NewObjectProto((JSContext *)0x11e47f,proto_00);
    local_78 = (JSValueUnion)JVar4.tag;
    in_stack_ffffffffffffff20 = SUB84(in_RDI,0);
    in_stack_ffffffffffffff24 = (int)((ulong)in_RDI >> 0x20);
    JS_NewAtomString((JSContext *)CONCAT44(len,uVar6),(char *)CONCAT44(atom,iVar5));
    JS_DefinePropertyValue
              (ctx_01,in_stack_ffffffffffffff60,(JSAtom)((ulong)proto_01 >> 0x20),
               in_stack_ffffffffffffff50,JVar4.u._0_4_);
    in_stack_ffffffffffffff60 = JS_AtomToString((JSContext *)CONCAT44(len,uVar6),atom);
    iVar5 = 3;
    JS_DefinePropertyValue
              (ctx_01,in_stack_ffffffffffffff60,(JSAtom)((ulong)proto_01 >> 0x20),
               in_stack_ffffffffffffff50,JVar4.u._0_4_);
    in_RDI->native_error_proto[local_1c].u = JVar4.u;
    (&in_RDI->native_error_proto[local_1c].u)[1] = local_78;
  }
  ctx_00 = (JSContext *)in_RDI->class_proto;
  proto_val.tag._0_4_ = in_stack_ffffffffffffff20;
  proto_val.u.ptr = (void *)in_stack_ffffffffffffff18;
  proto_val.tag._4_4_ = in_stack_ffffffffffffff24;
  JVar4 = JS_NewObjectProtoClass(ctx_00,proto_val,in_stack_ffffffffffffff0c);
  (ctx_00->link).prev = (list_head *)JVar4.u;
  (ctx_00->link).next = (list_head *)JVar4.tag;
  get_proto_obj(in_RDI->class_proto[2]);
  pJVar3 = js_new_shape2(ctx_01,proto_01,(int)((ulong)p >> 0x20),(int)p);
  in_RDI->array_shape = pJVar3;
  add_shape_property(ctx_01,(JSShape **)proto_01,(JSObject *)p,(JSAtom)((ulong)name >> 0x20),
                     (int)name);
  return;
}

Assistant:

static void JS_AddIntrinsicBasicObjects(JSContext *ctx)
{
    JSValue proto;
    int i;

    ctx->class_proto[JS_CLASS_OBJECT] = JS_NewObjectProto(ctx, JS_NULL);
    ctx->function_proto = JS_NewCFunction3(ctx, js_function_proto, "", 0,
                                           JS_CFUNC_generic, 0,
                                           ctx->class_proto[JS_CLASS_OBJECT]);
    ctx->class_proto[JS_CLASS_BYTECODE_FUNCTION] = JS_DupValue(ctx, ctx->function_proto);
    ctx->class_proto[JS_CLASS_ERROR] = JS_NewObject(ctx);
#if 0
    /* these are auto-initialized from js_error_proto_funcs,
       but delaying might be a problem */
    JS_DefinePropertyValue(ctx, ctx->class_proto[JS_CLASS_ERROR], JS_ATOM_name,
                           JS_AtomToString(ctx, JS_ATOM_Error),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    JS_DefinePropertyValue(ctx, ctx->class_proto[JS_CLASS_ERROR], JS_ATOM_message,
                           JS_AtomToString(ctx, JS_ATOM_empty_string),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
#endif
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ERROR],
                               js_error_proto_funcs,
                               countof(js_error_proto_funcs));

    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        proto = JS_NewObjectProto(ctx, ctx->class_proto[JS_CLASS_ERROR]);
        JS_DefinePropertyValue(ctx, proto, JS_ATOM_name,
                               JS_NewAtomString(ctx, native_error_name[i]),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        JS_DefinePropertyValue(ctx, proto, JS_ATOM_message,
                               JS_AtomToString(ctx, JS_ATOM_empty_string),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        ctx->native_error_proto[i] = proto;
    }

    /* the array prototype is an array */
    ctx->class_proto[JS_CLASS_ARRAY] =
        JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                               JS_CLASS_ARRAY);

    ctx->array_shape = js_new_shape2(ctx, get_proto_obj(ctx->class_proto[JS_CLASS_ARRAY]),
                                     JS_PROP_INITIAL_HASH_SIZE, 1);
    add_shape_property(ctx, &ctx->array_shape, NULL,
                       JS_ATOM_length, JS_PROP_WRITABLE | JS_PROP_LENGTH);

    /* XXX: could test it on first context creation to ensure that no
       new atoms are created in JS_AddIntrinsicBasicObjects(). It is
       necessary to avoid useless renumbering of atoms after
       JS_EvalBinary() if it is done just after
       JS_AddIntrinsicBasicObjects(). */
    //    assert(ctx->rt->atom_count == JS_ATOM_END);
}